

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# longint.c
# Opt level: O0

pLongInt longint_difference(pLongInt a,pLongInt b)

{
  pLongInt res;
  pLongInt b_local;
  pLongInt a_local;
  
  a_local = create_longint();
  if (a_local == (pLongInt)0x0) {
    printf("longint_difference: create_longint failed\n");
    a_local = (pLongInt)0x0;
  }
  else {
    a_local->num = a->num - b->num;
  }
  return a_local;
}

Assistant:

pLongInt longint_difference(pLongInt a, pLongInt b)
{
    pLongInt res = create_longint();
    if (res == NULL)
    {
        log("longint_difference: create_longint failed");
        return NULL;
    }
    res->num = a->num - b->num;
    return res;
}